

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitIdentifier(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  char cVar1;
  long lVar2;
  AsmJsFunc *pAVar3;
  code *pcVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Types TVar10;
  RegSlot R0;
  undefined4 *puVar11;
  IdentPtr name;
  AsmJsSymbol *sym;
  AsmJsVarBase *pAVar12;
  AsmJsVar *pAVar13;
  AsmJsMathConst *pAVar14;
  RegSlot *pRVar15;
  RegisterSpace *pRVar16;
  AsmJsCompilationException *this_00;
  int32 i32y;
  RegSlot R1;
  OpCodeAsmJs OVar17;
  DictionaryStats *this_01;
  uint32 slotId;
  long i64;
  ulong uVar18;
  double dVar19;
  AsmJsType local_50;
  Source local_4c;
  undefined4 uStack_48;
  Source source;
  RegisterSpace *local_40;
  RegSlot local_38;
  char local_31;
  
  if ((pnode->nop != knopName) && (pnode->nop != knopStr)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x575,"(ParserWrapper::IsNameDeclaration( pnode ))",
                                "ParserWrapper::IsNameDeclaration( pnode )");
    if (!bVar5) goto LAB_009496bd;
    *puVar11 = 0;
  }
  name = ParseNode::name(pnode);
  sym = AsmJsModuleCompiler::LookupIdentifier(this->mCompiler,name,this->mFunction,&local_4c);
  if (sym == (AsmJsSymbol *)0x0) {
    this_00 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_00,L"Undefined identifier %s",&name->field_0x22);
LAB_009496ac:
    __cxa_throw(this_00,&AsmJsCompilationException::typeinfo,0);
  }
  switch(sym->mType) {
  case Variable:
    break;
  case Argument:
  case ConstantImport:
    goto switchD_00948f5e_caseD_1;
  case MathConstant:
    pAVar14 = AsmJsMathConst::FromSymbol(sym);
    local_50.which_ = (**(pAVar14->super_AsmJsSymbol)._vptr_AsmJsSymbol)(pAVar14);
    bVar5 = AsmJsType::isDouble(&local_50);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x5c3,"(mathConst->GetType().isDouble())",
                                  "mathConst->GetType().isDouble()");
      if (!bVar5) goto LAB_009496bd;
      *puVar11 = 0;
    }
    pAVar3 = this->mFunction;
    TVar10 = WAsmJs::FromPrimitiveType<double>();
    pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar3->mTypedRegisterAllocator,TVar10);
    local_38 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar16);
    dVar19 = *pAVar14->mVal;
    pAVar3 = this->mFunction;
    TVar10 = WAsmJs::FromPrimitiveType<double>();
    pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar3->mTypedRegisterAllocator,TVar10);
    lVar2 = *(long *)&pRVar16[1].mFirstTmpReg;
    uVar9 = 0;
    if (lVar2 != 0) {
      uVar9 = JsUtil::
              BaseDictionary<double,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetBucket(((uint)((ulong)dVar19 >> 0x20) ^ SUB84(dVar19,0)) * 2 + 1,
                          pRVar16[2].mNbConst,pRVar16[3].mNextLocation);
      uVar7 = *(uint *)(lVar2 + (ulong)uVar9 * 4);
      uVar9 = 0;
      if (-1 < (int)uVar7) {
        uVar9 = 0;
        do {
          if (*(double *)(*(long *)&pRVar16[1].mNbConst + 8 + (ulong)uVar7 * 0x10) == dVar19) {
            this_01 = *(DictionaryStats **)&pRVar16[3].mNbConst;
            goto LAB_00949196;
          }
          uVar9 = uVar9 + 1;
          uVar7 = *(uint *)((ulong)uVar7 * 0x10 + *(long *)&pRVar16[1].mNbConst + 4);
        } while (-1 < (int)uVar7);
      }
    }
    this_01 = *(DictionaryStats **)&pRVar16[3].mNbConst;
    uVar7 = 0xffffffff;
LAB_00949196:
    if (this_01 != (DictionaryStats *)0x0) {
      DictionaryStats::Lookup(this_01,uVar9);
    }
    R0 = local_38;
    if ((int)uVar7 < 0) {
      pRVar15 = &Constants::NoRegister;
    }
    else {
      pRVar15 = (RegSlot *)((ulong)uVar7 * 0x10 + *(long *)&pRVar16[1].mNbConst);
    }
    AsmJsByteCodeWriter::AsmReg2(&this->mWriter,Ld_Db,local_38,*pRVar15);
    uVar18 = 2;
    goto LAB_00949636;
  default:
    this_00 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_00,L"Cannot use identifier %s in this context",&name->field_0x22);
    goto LAB_009496ac;
  }
  pAVar13 = AsmJsVar::FromSymbol(sym);
  iVar8 = (*(pAVar13->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol[1])(pAVar13);
  cVar6 = (char)iVar8;
  if (cVar6 == '\0') {
    if (local_4c != AsmJsModule) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x586,"(source == AsmJsLookupSource::AsmJsModule)",
                                  "source == AsmJsLookupSource::AsmJsModule");
      if (!bVar5) goto LAB_009496bd;
      *puVar11 = 0;
    }
    uVar7 = (**(pAVar13->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol)(pAVar13);
    uVar18 = (ulong)uVar7;
    cVar1 = (pAVar13->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14;
    local_31 = cVar6;
    if (cVar1 == '\x03') {
      pAVar3 = this->mFunction;
      TVar10 = WAsmJs::FromPrimitiveType<float>();
      pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&pAVar3->mTypedRegisterAllocator,TVar10);
      local_38 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar16);
      uStack_48 = (pAVar13->mConstInitialiser).intVal;
      pAVar3 = this->mFunction;
      TVar10 = WAsmJs::FromPrimitiveType<float>();
      pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&pAVar3->mTypedRegisterAllocator,TVar10);
      lVar2 = *(long *)&pRVar16[1].mFirstTmpReg;
      uVar9 = 0;
      if (lVar2 != 0) {
        local_40 = pRVar16;
        uVar9 = JsUtil::
                BaseDictionary<float,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetBucket((int)(long)(float)uStack_48 * 2 + 1,pRVar16[2].mNbConst,
                            pRVar16[3].mNextLocation);
        uVar7 = *(uint *)(lVar2 + (ulong)uVar9 * 4);
        pRVar16 = local_40;
        uVar9 = 0;
        if (-1 < (int)uVar7) {
          uVar9 = 0;
          do {
            if (*(int *)(*(long *)&local_40[1].mNbConst + 8 + (ulong)uVar7 * 0xc) == uStack_48) {
              if (*(DictionaryStats **)&local_40[3].mNbConst != (DictionaryStats *)0x0) {
                DictionaryStats::Lookup(*(DictionaryStats **)&local_40[3].mNbConst,uVar9);
                pRVar16 = local_40;
              }
              goto LAB_009494a3;
            }
            uVar9 = uVar9 + 1;
            uVar7 = *(uint *)(*(long *)&local_40[1].mNbConst + (ulong)uVar7 * 0xc + 4);
          } while (-1 < (int)uVar7);
        }
      }
      uVar7 = 0xffffffff;
      if (*(DictionaryStats **)&pRVar16[3].mNbConst != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(*(DictionaryStats **)&pRVar16[3].mNbConst,uVar9);
      }
LAB_009494a3:
      if ((int)uVar7 < 0) {
        pRVar15 = &Constants::NoRegister;
      }
      else {
        pRVar15 = (RegSlot *)((ulong)uVar7 * 0xc + *(long *)&pRVar16[1].mNbConst);
      }
      R1 = *pRVar15;
      OVar17 = Ld_Flt;
LAB_00949620:
      R0 = local_38;
      AsmJsByteCodeWriter::AsmReg2(&this->mWriter,OVar17,local_38,R1);
    }
    else {
      if (cVar1 == '\x02') {
LAB_00949511:
        pAVar3 = this->mFunction;
        TVar10 = WAsmJs::FromPrimitiveType<double>();
        pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                            (&pAVar3->mTypedRegisterAllocator,TVar10);
        local_38 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar16);
        _uStack_48 = pAVar13->mConstInitialiser;
        pAVar3 = this->mFunction;
        TVar10 = WAsmJs::FromPrimitiveType<double>();
        pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                            (&pAVar3->mTypedRegisterAllocator,TVar10);
        lVar2 = *(long *)&pRVar16[1].mFirstTmpReg;
        uVar9 = 0;
        if (lVar2 != 0) {
          local_40 = pRVar16;
          uVar9 = JsUtil::
                  BaseDictionary<double,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::GetBucket((uStack_48._4_4_ ^ uStack_48) * 2 + 1,pRVar16[2].mNbConst,
                              pRVar16[3].mNextLocation);
          uVar7 = *(uint *)(lVar2 + (ulong)uVar9 * 4);
          pRVar16 = local_40;
          uVar9 = 0;
          if (-1 < (int)uVar7) {
            uVar9 = 0;
            do {
              if (*(anon_union_8_3_a2f2c9fd_for_mConstInitialiser *)
                   (*(long *)&local_40[1].mNbConst + 8 + (ulong)uVar7 * 0x10) == _uStack_48) {
                if (*(DictionaryStats **)&local_40[3].mNbConst != (DictionaryStats *)0x0) {
                  DictionaryStats::Lookup(*(DictionaryStats **)&local_40[3].mNbConst,uVar9);
                  pRVar16 = local_40;
                }
                goto LAB_009495e4;
              }
              uVar9 = uVar9 + 1;
              uVar7 = *(uint *)((ulong)uVar7 * 0x10 + *(long *)&local_40[1].mNbConst + 4);
            } while (-1 < (int)uVar7);
          }
        }
        uVar7 = 0xffffffff;
        if (*(DictionaryStats **)&pRVar16[3].mNbConst != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)&pRVar16[3].mNbConst,uVar9);
        }
LAB_009495e4:
        if ((int)uVar7 < 0) {
          pRVar15 = &Constants::NoRegister;
        }
        else {
          pRVar15 = (RegSlot *)((ulong)uVar7 * 0x10 + *(long *)&pRVar16[1].mNbConst);
        }
        R1 = *pRVar15;
        OVar17 = Ld_Db;
        goto LAB_00949620;
      }
      if (cVar1 != '\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x595,"(var->GetVarType().isDouble())",
                                    "var->GetVarType().isDouble()");
        if (!bVar5) goto LAB_009496bd;
        *puVar11 = 0;
        goto LAB_00949511;
      }
      pAVar3 = this->mFunction;
      TVar10 = WAsmJs::FromPrimitiveType<int>();
      pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&pAVar3->mTypedRegisterAllocator,TVar10);
      R0 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar16);
      AsmJsByteCodeWriter::AsmInt1Const1
                (&this->mWriter,Ld_IntConst,R0,(pAVar13->mConstInitialiser).intVal);
    }
    if (local_31 == '\0') goto LAB_00949636;
  }
switchD_00948f5e_caseD_1:
  pAVar12 = AsmJsVarBase::FromSymbol(sym);
  if (local_4c != AsmJsModule) {
    if (local_4c == AsmJsFunction) {
      R0 = pAVar12->mLocation;
      uVar7 = (**(pAVar12->super_AsmJsSymbol)._vptr_AsmJsSymbol)(pAVar12);
      uVar18 = (ulong)uVar7;
      goto LAB_00949636;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x5a7,"(source == AsmJsLookupSource::AsmJsModule)",
                                "source == AsmJsLookupSource::AsmJsModule");
    if (!bVar5) goto LAB_009496bd;
    *puVar11 = 0;
  }
  uVar7 = (**(pAVar12->super_AsmJsSymbol)._vptr_AsmJsSymbol)(pAVar12);
  uVar18 = (ulong)uVar7;
  cVar6 = (pAVar12->super_AsmJsSymbol).field_0x14;
  if (cVar6 == '\x03') {
    pAVar3 = this->mFunction;
    TVar10 = WAsmJs::FromPrimitiveType<float>();
    pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar3->mTypedRegisterAllocator,TVar10);
    R0 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar16);
    dVar19 = (double)(this->mCompiler->mModuleMemory).mFloatOffset;
    slotId = (int)(dVar19 + dVar19 + 0.5) + pAVar12->mLocation;
    OVar17 = LdSlot_Flt;
  }
  else if (cVar6 == '\x02') {
    pAVar3 = this->mFunction;
    TVar10 = WAsmJs::FromPrimitiveType<double>();
    pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar3->mTypedRegisterAllocator,TVar10);
    R0 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar16);
    slotId = (this->mCompiler->mModuleMemory).mDoubleOffset + pAVar12->mLocation;
    OVar17 = LdSlot_Db;
  }
  else {
    if (cVar6 != '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x5ba,"((0))","UNREACHED");
      if (!bVar5) {
LAB_009496bd:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar11 = 0;
      R0 = 0xffffffff;
      goto LAB_00949636;
    }
    pAVar3 = this->mFunction;
    TVar10 = WAsmJs::FromPrimitiveType<int>();
    pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar3->mTypedRegisterAllocator,TVar10);
    R0 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar16);
    dVar19 = (double)(this->mCompiler->mModuleMemory).mIntOffset;
    slotId = (int)(dVar19 + dVar19 + 0.5) + pAVar12->mLocation;
    OVar17 = LdSlot_Int;
  }
  AsmJsByteCodeWriter::AsmSlot(&this->mWriter,OVar17,R0,1,slotId);
LAB_00949636:
  return (EmitExpressionInfo)((ulong)R0 | uVar18 << 0x20);
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitIdentifier( ParseNode * pnode )
    {
        Assert( ParserWrapper::IsNameDeclaration( pnode ) );
        PropertyName name = pnode->name();
        AsmJsLookupSource::Source source;
        AsmJsSymbol* sym = mCompiler->LookupIdentifier( name, mFunction, &source );
        if( !sym )
        {
            throw AsmJsCompilationException( _u("Undefined identifier %s"), name->Psz() );
        }

        switch( sym->GetSymbolType() )
        {
        case AsmJsSymbol::Variable:
        {
            AsmJsVar * var = AsmJsVar::FromSymbol(sym);
            if (!var->isMutable())
            {
                // currently const is only allowed for variables at module scope
                Assert(source == AsmJsLookupSource::AsmJsModule);

                EmitExpressionInfo emitInfo(var->GetType());
                if (var->GetVarType().isInt())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<int>();
                    mWriter.AsmInt1Const1(Js::OpCodeAsmJs::Ld_IntConst, emitInfo.location, var->GetIntInitialiser());
                }
                else if (var->GetVarType().isFloat())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<float>();
                    mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Flt, emitInfo.location, mFunction->GetConstRegister<float>(var->GetFloatInitialiser()));
                }
                else
                {
                    Assert(var->GetVarType().isDouble());
                    emitInfo.location = mFunction->AcquireTmpRegister<double>();
                    mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Db, emitInfo.location, mFunction->GetConstRegister<double>(var->GetDoubleInitialiser()));
                }
                return emitInfo;
            }
            // else fall through
        }
        case AsmJsSymbol::Argument:
        case AsmJsSymbol::ConstantImport:
        {
            AsmJsVarBase* var = AsmJsVarBase::FromSymbol(sym);
            if( source == AsmJsLookupSource::AsmJsFunction )
            {
                return EmitExpressionInfo( var->GetLocation(), var->GetType() );
            }
            else
            {
                Assert( source == AsmJsLookupSource::AsmJsModule );
                EmitExpressionInfo emitInfo(var->GetType());
                if (var->GetVarType().isInt())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<int>();
                    LoadModuleInt(emitInfo.location, var->GetLocation());
                }
                else if (var->GetVarType().isFloat())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<float>();
                    LoadModuleFloat(emitInfo.location, var->GetLocation());
                }
                else if (var->GetVarType().isDouble())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<double>();
                    LoadModuleDouble(emitInfo.location, var->GetLocation());
                }
                else
                {
                    Assert(UNREACHED);
                }
                return emitInfo;
            }
            break;
        }
        case AsmJsSymbol::MathConstant:
        {
            AsmJsMathConst* mathConst = AsmJsMathConst::FromSymbol(sym);
            Assert(mathConst->GetType().isDouble());
            RegSlot loc = mFunction->AcquireTmpRegister<double>();
            mWriter.AsmReg2( OpCodeAsmJs::Ld_Db, loc, mFunction->GetConstRegister<double>(*mathConst->GetVal()) );
            return EmitExpressionInfo(loc, AsmJsType::Double);
        }

        case AsmJsSymbol::ImportFunction:
        case AsmJsSymbol::FuncPtrTable:
        case AsmJsSymbol::ModuleFunction:
        case AsmJsSymbol::ArrayView:
        case AsmJsSymbol::MathBuiltinFunction:
        default:
            throw AsmJsCompilationException( _u("Cannot use identifier %s in this context"), name->Psz() );
        }
    }